

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Global::Mark(Global *this,Store *store)

{
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = *(int *)&(this->type_).super_ExternType.field_0xc + 0x18;
  if ((uVar3 < 0x1b) && ((0x40001c1U >> (uVar3 & 0x1f) & 1) != 0)) {
    uVar2 = (this->value_).i64_;
    uVar4 = uVar2 + 0x3f;
    if (-1 < (long)uVar2) {
      uVar4 = uVar2;
    }
    puVar1 = (store->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
             ((long)uVar4 >> 6) +
             (ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
    *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
  }
  return;
}

Assistant:

void Global::Mark(Store& store) {
  if (IsReference(type_.type)) {
    store.Mark(value_.ref_);
  }
}